

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

Ptr __thiscall
TgBot::Api::getUserProfilePhotos(Api *this,int32_t userId,int32_t offset,int32_t limit)

{
  int *piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Api *this_00;
  Ptr PVar2;
  allocator local_a1;
  string local_a0;
  ptree local_80;
  int local_54 [5];
  undefined1 local_40 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  int32_t local_20;
  int32_t limit_local;
  int32_t offset_local;
  int32_t userId_local;
  Api *this_local;
  
  this_00 = (Api *)CONCAT44(in_register_00000034,userId);
  local_20 = limit;
  limit_local = offset;
  _offset_local = this_00;
  this_local = this;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_40);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_40,3);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_40,
             (char (*) [8])"user_id",&limit_local);
  if (local_20 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[7],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_40,
               (char (*) [7])0x47421d,&local_20);
  }
  local_54[1] = 1;
  local_54[0] = 100;
  piVar1 = std::min<int>(local_54,(int *)((long)&args.
                                                 super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + 4));
  piVar1 = std::max<int>(local_54 + 1,piVar1);
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = *piVar1;
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[6],int&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_40,
             (char (*) [6])0x47ff4e,
             (int *)((long)&args.
                            super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"getUserProfilePhotos",&local_a1);
  sendRequest(&local_80,this_00,&local_a0,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_40);
  TgTypeParser::parseJsonAndGetUserProfilePhotos((TgTypeParser *)this,(ptree *)&this_00->field_0x28)
  ;
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_40);
  PVar2.super___shared_ptr<TgBot::UserProfilePhotos,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<TgBot::UserProfilePhotos,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<TgBot::UserProfilePhotos,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UserProfilePhotos::Ptr Api::getUserProfilePhotos(int32_t userId, int32_t offset, int32_t limit) const {
    vector<HttpReqArg> args;
    args.reserve(3);
    args.emplace_back("user_id", userId);
    if (offset) {
        args.emplace_back("offset", offset);
    }
    limit = max(1, min(100, limit));
    args.emplace_back("limit", limit);
    return _tgTypeParser.parseJsonAndGetUserProfilePhotos(sendRequest("getUserProfilePhotos", args));
}